

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_ring_node(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  iVar1 = ref_node->max;
  if (0 < iVar1) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (-1 < ref_node->global[lVar3]) {
        dVar5 = *(double *)((long)ref_node->real + lVar4) + -1.0;
        if (dVar5 <= -dVar5) {
          dVar5 = -dVar5;
        }
        dVar5 = dVar5 + dVar5;
        if (1.0 <= dVar5) {
          dVar5 = 1.0;
        }
        dVar5 = dVar5 * 0.09000000000000001 + 0.01;
        uVar2 = ref_node_metric_form
                          (ref_node,(REF_INT)lVar3,1.0 / (dVar5 * dVar5),0.0,0.0,99.99999999999999,
                           0.0,99.99999999999999);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x78,"ref_metric_ring_node",(ulong)uVar2,"set node met");
          return uVar2;
        }
        iVar1 = ref_node->max;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar3 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_ring_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL hh;
  REF_DBL h = 0.01;
  REF_DBL x;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    hh = h + (0.1 - h) * MIN(2 * ABS(x - 1.0), 1);
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (hh * hh), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (0.1 * 0.1)),
        "set node met");
  }

  return REF_SUCCESS;
}